

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

Expression * __thiscall
soul::StructuralParser::checkAndCreateArrayElementRef
          (StructuralParser *this,Context *c,Expression *lhs,pool_ptr<soul::AST::Expression> *start,
          pool_ptr<soul::AST::Expression> *end)

{
  ExpressionKind EVar1;
  Expression *pEVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ArrayElementRef *pAVar6;
  pool_ptr<soul::AST::Constant> endConst;
  pool_ptr<soul::AST::Constant> startConst;
  long local_1a8;
  long local_1a0;
  PackedData local_198;
  CompileMessage local_180;
  CompileMessage local_148;
  CompileMessage local_110;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  EVar1 = lhs->kind;
  if ((((EVar1 & ~unknown) != value) && (EVar1 != endpoint)) && (EVar1 != unknown)) {
    CompileMessageHelpers::createMessage<>(&local_68,syntax,error,"Expected a value or endpoint");
    AST::Context::throwError(&(lhs->super_Statement).super_ASTObject.context,&local_68,false);
  }
  pEVar2 = start->object;
  if ((pEVar2 != (Expression *)0x0) &&
     ((start->object == (Expression *)0x0 || ((start->object->kind & ~unknown) != value)))) {
    CompileMessageHelpers::createMessage<>(&local_a0,syntax,error,"Expected a value");
    AST::Context::throwError(&(pEVar2->super_Statement).super_ASTObject.context,&local_a0,false);
  }
  pEVar2 = end->object;
  if ((pEVar2 != (Expression *)0x0) &&
     ((end->object == (Expression *)0x0 || ((end->object->kind & ~unknown) != value)))) {
    CompileMessageHelpers::createMessage<>(&local_d8,syntax,error,"Expected a value");
    AST::Context::throwError(&(pEVar2->super_Statement).super_ASTObject.context,&local_d8,false);
  }
  if (start->object != (Expression *)0x0) {
    bVar3 = AST::isResolvedAsConstant(start->object);
    if ((bVar3) && (end->object != (Expression *)0x0)) {
      bVar3 = AST::isResolvedAsConstant(end->object);
      if (bVar3) {
        if (start->object == (Expression *)0x0) {
          throwInternalCompilerError("object != nullptr","operator->",0x3c);
        }
        (*(start->object->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_1a0);
        if (end->object == (Expression *)0x0) {
          throwInternalCompilerError("object != nullptr","operator->",0x3c);
        }
        (*(end->object->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_1a8);
        if (local_1a0 != 0) {
          if (*(int *)(local_1a0 + 0x34) - 7U < 2) {
            if (local_1a8 != 0) {
              if (*(int *)(local_1a8 + 0x34) - 7U < 2) {
                soul::Value::getData(&local_198,(Value *)(local_1a0 + 0x30));
                uVar4 = soul::Value::PackedData::getAsInt64(&local_198);
                if (local_1a8 != 0) {
                  soul::Value::getData(&local_198,(Value *)(local_1a8 + 0x30));
                  uVar5 = soul::Value::PackedData::getAsInt64(&local_198);
                  if (((long)uVar4 < (long)uVar5 || (long)(uVar5 | uVar4) < 0) &&
                     (-1 < (long)(uVar5 & uVar4) || (long)uVar4 < (long)uVar5)) goto LAB_001faf5a;
                  pEVar2 = end->object;
                  if (pEVar2 != (Expression *)0x0) {
                    CompileMessageHelpers::createMessage<>
                              (&local_180,syntax,error,"Invalid array slice range");
                    AST::Context::throwError
                              (&(pEVar2->super_Statement).super_ASTObject.context,&local_180,false);
                  }
                }
                throwInternalCompilerError("object != nullptr","operator->",0x3c);
              }
              pEVar2 = end->object;
              if (pEVar2 != (Expression *)0x0) {
                CompileMessageHelpers::createMessage<>
                          (&local_148,syntax,error,"Expected an integer");
                AST::Context::throwError
                          (&(pEVar2->super_Statement).super_ASTObject.context,&local_148,false);
              }
            }
          }
          else {
            pEVar2 = start->object;
            if (pEVar2 != (Expression *)0x0) {
              CompileMessageHelpers::createMessage<>(&local_110,syntax,error,"Expected an integer");
              AST::Context::throwError
                        (&(pEVar2->super_Statement).super_ASTObject.context,&local_110,false);
            }
          }
        }
        throwInternalCompilerError("object != nullptr","operator->",0x3c);
      }
    }
  }
LAB_001faf5a:
  local_198.type._0_1_ = 1;
  pAVar6 = PoolAllocator::
           allocate<soul::AST::ArrayElementRef,soul::AST::Context_const&,soul::AST::Expression&,soul::pool_ptr<soul::AST::Expression>&,soul::pool_ptr<soul::AST::Expression>&,bool>
                     (&this->allocator->pool,c,lhs,start,end,(bool *)&local_198);
  return &pAVar6->super_Expression;
}

Assistant:

AST::Expression& checkAndCreateArrayElementRef (const AST::Context& c, AST::Expression& lhs,
                                                    pool_ptr<AST::Expression> start,
                                                    pool_ptr<AST::Expression> end)
    {
        if (! (AST::isPossiblyValue (lhs) || AST::isPossiblyEndpoint (lhs)))
            lhs.context.throwError (Errors::expectedValueOrEndpoint());

        if (start != nullptr && ! AST::isPossiblyValue (start))   start->context.throwError (Errors::expectedValue());
        if (end != nullptr   && ! AST::isPossiblyValue (end))     end->context.throwError (Errors::expectedValue());

        if (AST::isResolvedAsConstant (start) && AST::isResolvedAsConstant (end))
        {
            auto startConst = start->getAsConstant();
            auto endConst = end->getAsConstant();

            if (! startConst->value.getType().isInteger())  start->context.throwError (Errors::expectedInteger());
            if (! endConst->value.getType().isInteger())    end->context.throwError (Errors::expectedInteger());

            auto s = startConst->value.getAsInt64();
            auto e = endConst->value.getAsInt64();

            if ((s >= 0 && e >= 0 && s >= e) || (s < 0 && e < 0 && s >= e))
                end->context.throwError (Errors::illegalSliceSize());
        }

        return allocate<AST::ArrayElementRef> (c, lhs, start, end, true);
    }